

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O3

MessageLite *
google::protobuf::internal::MergePartialFromCodedStreamHelper::Add
          (RepeatedPtrFieldBase *field,MessageLite *prototype)

{
  int iVar1;
  Rep *pRVar2;
  undefined4 extraout_var;
  int iVar3;
  
  pRVar2 = field->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = field->total_size_;
  }
  else {
    iVar1 = field->current_size_;
    iVar3 = pRVar2->allocated_size;
    if (iVar1 < iVar3) {
      field->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar2->elements[iVar1];
    }
    if (iVar3 != field->total_size_) goto LAB_0015a2fd;
  }
  RepeatedPtrFieldBase::Reserve(field,iVar3 + 1);
  pRVar2 = field->rep_;
  iVar3 = pRVar2->allocated_size;
LAB_0015a2fd:
  pRVar2->allocated_size = iVar3 + 1;
  iVar1 = (*prototype->_vptr_MessageLite[4])(prototype,field->arena_);
  iVar3 = field->current_size_;
  field->current_size_ = iVar3 + 1;
  field->rep_->elements[iVar3] = (MessageLite *)CONCAT44(extraout_var,iVar1);
  return (MessageLite *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static MessageLite* Add(RepeatedPtrFieldBase* field,
                          const MessageLite* prototype) {
    return field->Add<RepeatedMessageTypeHandler>(
        const_cast<MessageLite*>(prototype));
  }